

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

void my_do_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined1 local_20 [8];
  Am_Value value;
  Am_Object *cmd_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)cmd;
  Am_Value::Am_Value((Am_Value *)local_20);
  pAVar1 = Am_Object::Peek(cmd,0x169,0);
  Am_Value::operator=((Am_Value *)local_20,(Am_Value *)pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n+-+-+- Command ");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Object *)cmd);
  poVar2 = std::operator<<(poVar2," value = ");
  pvVar3 = (void *)operator<<(poVar2,(Am_Value *)local_20);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, my_do, (Am_Object cmd))
{
  Am_Value value;
  value = cmd.Peek(Am_VALUE);
  std::cout << "\n+-+-+- Command " << cmd << " value = " << value << std::endl
            << std::flush;
}